

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_mp3_get_length_in_pcm_frames(ma_mp3 *pMP3,ma_uint64 *pLength)

{
  ma_bool32 mVar1;
  ma_uint64 in_RAX;
  ma_uint64 mVar2;
  ma_result mVar3;
  ma_uint64 totalPCMFrameCount;
  ma_uint64 local_18;
  
  mVar3 = MA_INVALID_ARGS;
  if ((pLength != (ma_uint64 *)0x0) && (*pLength = 0, pMP3 != (ma_mp3 *)0x0)) {
    mVar3 = MA_SUCCESS;
    local_18 = in_RAX;
    mVar1 = ma_dr_mp3_get_mp3_and_pcm_frame_count(&pMP3->dr,(ma_uint64 *)0x0,&local_18);
    mVar2 = 0;
    if (mVar1 != 0) {
      mVar2 = local_18;
    }
    *pLength = mVar2;
  }
  return mVar3;
}

Assistant:

MA_API ma_result ma_mp3_get_length_in_pcm_frames(ma_mp3* pMP3, ma_uint64* pLength)
{
    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = 0;   /* Safety. */

    if (pMP3 == NULL) {
        return MA_INVALID_ARGS;
    }

    #if !defined(MA_NO_MP3)
    {
        *pLength = ma_dr_mp3_get_pcm_frame_count(&pMP3->dr);

        return MA_SUCCESS;
    }
    #else
    {
        /* mp3 is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}